

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestCase * __thiscall testing::UnitTest::GetMutableTestCase(UnitTest *this,int i)

{
  UnitTestImpl *pUVar1;
  pointer piVar2;
  TestCase *pTVar3;
  uint uVar4;
  
  pUVar1 = this->impl_;
  uVar4 = 0xffffffff;
  if ((-1 < i) &&
     (piVar2 = (pUVar1->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(pUVar1->test_case_indices_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar2) >> 2))) {
    uVar4 = piVar2[(uint)i];
  }
  if ((int)uVar4 < 0) {
    pTVar3 = (TestCase *)0x0;
  }
  else {
    pTVar3 = (pUVar1->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
  }
  return pTVar3;
}

Assistant:

TestCase* UnitTest::GetMutableTestCase(int i) {
  return impl()->GetMutableTestCase(i);
}